

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

void __thiscall
udpdiscovery::impl::PeerEnv::decreaseRefCountAndMaybeDestroySelfAndUnlock(PeerEnv *this)

{
  int iVar1;
  ostream *this_00;
  int cur_ref_count;
  PeerEnv *this_local;
  
  this->ref_count_ = this->ref_count_ + -1;
  iVar1 = this->ref_count_;
  MinimalisticMutex::Unlock(&this->lock_);
  if (iVar1 < 1) {
    if (iVar1 < 0) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Strangly ref count is less than 0.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    if (this != (PeerEnv *)0x0) {
      (*(this->super_PeerEnvInterface)._vptr_PeerEnvInterface[1])();
    }
  }
  return;
}

Assistant:

void decreaseRefCountAndMaybeDestroySelfAndUnlock() {
    --ref_count_;
    int cur_ref_count = ref_count_;

    // This method is performed when the mutex is locked.
    lock_.Unlock();

    if (cur_ref_count <= 0) {
      if (cur_ref_count < 0) {
        // Shouldn't be there.
        std::cerr << "Strangly ref count is less than 0." << std::endl;
      }

      delete this;
    }
  }